

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O1

bool __thiscall
dg::pta::PointerIdPointsToSet::addWithUnknownOffset(PointerIdPointsToSet *this,PSNode *node)

{
  bool bVar1;
  IDTy i;
  mapped_type *pmVar2;
  ulong uVar3;
  unsigned_long sft;
  Pointer local_28;
  
  local_28.offset.offset = Offset::UNKNOWN;
  local_28.target = node;
  i = PointerIDLookupTable::getOrCreate((PointerIDLookupTable *)&lookupTable,&local_28);
  bVar1 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::get(&this->pointers,i);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    removeAny(this,node);
    local_28.target = (PSNode *)(i & 0xffffffffffffffc0);
    pmVar2 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,(key_type *)&local_28);
    uVar3 = (ulong)(uint)((int)i - (int)local_28.target);
    bVar1 = (*pmVar2 >> (uVar3 & 0x3f) & 1) == 0;
    *pmVar2 = *pmVar2 | 1L << (uVar3 & 0x3f);
  }
  return bVar1;
}

Assistant:

bool addWithUnknownOffset(PSNode *node) {
        auto ptrid = getPointerID({node, Offset::UNKNOWN});
        if (!pointers.get(ptrid)) {
            removeAny(node);
            return !pointers.set(ptrid);
        }
        return false; // we already had it
    }